

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::SliderBehaviorT<long_long,long_long,double>
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,longlong *v,longlong v_min,
               longlong v_max,char *format,ImGuiSliderFlags flags,ImRect *out_grab_bb)

{
  float fVar1;
  bool bVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  uint uVar5;
  float *pfVar6;
  bool is_logarithmic_00;
  bool bVar7;
  bool bVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float local_124;
  float local_120;
  float local_11c;
  bool local_115;
  int local_110;
  long local_108;
  ImRect local_f8;
  ImRect local_e8;
  float local_d8;
  float local_d4;
  float grab_pos_1;
  float grab_t_1;
  ImVec2 local_c8;
  longlong local_c0;
  longlong v_new_1;
  longlong lStack_b0;
  float new_clicked_t;
  longlong v_new;
  float local_a0;
  float old_clicked_t;
  float delta;
  int decimal_precision_1;
  float input_delta;
  ImVec2 input_delta2;
  float fStack_84;
  bool clicked_around_grab;
  float grab_pos;
  float grab_t;
  float mouse_abs_pos;
  float clicked_t;
  bool set_new_value;
  float fStack_70;
  bool value_changed;
  int decimal_precision;
  float zero_deadzone_halfsize;
  float logarithmic_zero_epsilon;
  float slider_usable_pos_max;
  float slider_usable_pos_min;
  float slider_usable_sz;
  float grab_sz;
  float slider_sz;
  float grab_padding;
  longlong v_range;
  bool is_floating_point;
  bool is_logarithmic;
  ImGuiAxis axis;
  ImGuiStyle *style;
  ImGuiContext *g;
  longlong v_max_local;
  longlong v_min_local;
  longlong *v_local;
  ImGuiDataType data_type_local;
  ImGuiID id_local;
  ImRect *bb_local;
  
  pIVar3 = GImGui;
  uVar5 = (uint)((flags & 0x100000U) != 0);
  is_logarithmic_00 = (flags & 0x20U) != 0;
  bVar7 = data_type == 8;
  bVar8 = data_type == 9;
  if (v_min < v_max) {
    local_108 = v_max - v_min;
  }
  else {
    local_108 = v_min - v_max;
  }
  fVar9 = ImVec2::operator[](&bb->Max,(long)(int)uVar5);
  fVar10 = ImVec2::operator[](&bb->Min,(long)(int)uVar5);
  fVar9 = (fVar9 - fVar10) - 4.0;
  slider_usable_pos_min = (pIVar3->Style).GrabMinSize;
  if ((!bVar7 && !bVar8) && (-1 < local_108)) {
    slider_usable_pos_min = ImMax<float>(fVar9 / (float)(local_108 + 1),(pIVar3->Style).GrabMinSize)
    ;
  }
  fVar10 = ImMin<float>(slider_usable_pos_min,fVar9);
  fVar11 = fVar9 - fVar10;
  fVar12 = ImVec2::operator[](&bb->Min,(long)(int)uVar5);
  fVar12 = fVar10 * 0.5 + fVar12 + 2.0;
  fVar13 = ImVec2::operator[](&bb->Max,(long)(int)uVar5);
  fVar13 = -fVar10 * 0.5 + (fVar13 - 2.0);
  decimal_precision = 0;
  fStack_70 = 0.0;
  if (is_logarithmic_00) {
    if (bVar7 || bVar8) {
      local_110 = ImParseFormatPrecision(format,3);
    }
    else {
      local_110 = 1;
    }
    decimal_precision = (int)ImPow(0.1,(float)local_110);
    fVar1 = (pIVar3->Style).LogSliderDeadzone;
    fStack_70 = ImMax<float>(fVar11,1.0);
    fStack_70 = (fVar1 * 0.5) / fStack_70;
  }
  mouse_abs_pos._3_1_ = false;
  if (pIVar3->ActiveId == id) {
    bVar2 = false;
    grab_t = 0.0;
    if (pIVar3->ActiveIdSource == ImGuiInputSource_Mouse) {
      if (((pIVar3->IO).MouseDown[0] & 1U) == 0) {
        ClearActiveID();
      }
      else {
        pfVar6 = ImVec2::operator[](&(pIVar3->IO).MousePos,(long)(int)uVar5);
        fVar1 = *pfVar6;
        if ((pIVar3->ActiveIdIsJustActivated & 1U) != 0) {
          fStack_84 = ScaleRatioFromValueT<long_long,long_long,double>
                                (data_type,*v,v_min,v_max,is_logarithmic_00,(float)decimal_precision
                                 ,fStack_70);
          if (uVar5 == 1) {
            fStack_84 = 1.0 - fStack_84;
          }
          input_delta2.y = ImLerp<float>(fVar12,fVar13,fStack_84);
          bVar2 = (-fVar10 * 0.5 + input_delta2.y) - 1.0 <= fVar1;
          bVar4 = fVar1 <= fVar10 * 0.5 + input_delta2.y + 1.0;
          local_115 = bVar2 && bVar4;
          input_delta2.x._3_1_ = local_115;
          if ((bVar2 && bVar4) && (bVar7 || bVar8)) {
            local_11c = fVar1 - input_delta2.y;
          }
          else {
            local_11c = 0.0;
          }
          pIVar3->SliderGrabClickOffset = local_11c;
        }
        if (0.0 < fVar11) {
          grab_t = ImSaturate(((fVar1 - pIVar3->SliderGrabClickOffset) - fVar12) / fVar11);
        }
        if (uVar5 == 1) {
          grab_t = 1.0 - grab_t;
        }
        bVar2 = true;
      }
    }
    else if (pIVar3->ActiveIdSource == ImGuiInputSource_Nav) {
      if ((pIVar3->ActiveIdIsJustActivated & 1U) != 0) {
        pIVar3->SliderCurrentAccum = 0.0;
        pIVar3->SliderCurrentAccumDirty = false;
      }
      _decimal_precision_1 = GetNavInputAmount2d(6,ImGuiNavReadMode_RepeatFast,0.0,0.0);
      if (uVar5 == 0) {
        local_120 = (float)decimal_precision_1;
      }
      else {
        local_120 = -input_delta;
      }
      delta = local_120;
      if ((local_120 != 0.0) || (NAN(local_120))) {
        if (bVar7 || bVar8) {
          local_124 = (float)ImParseFormatPrecision(format,3);
        }
        else {
          local_124 = 0.0;
        }
        old_clicked_t = local_124;
        if ((int)local_124 < 1) {
          if (((-100.0 <= (float)local_108) && ((float)local_108 <= 100.0)) ||
             (bVar4 = IsNavInputDown(0xe), bVar4)) {
            delta = (float)(~-(uint)(delta < 0.0) & 0x3f800000 | -(uint)(delta < 0.0) & 0xbf800000)
                    / (float)local_108;
          }
          else {
            delta = delta / 100.0;
          }
        }
        else {
          delta = delta / 100.0;
          bVar4 = IsNavInputDown(0xe);
          if (bVar4) {
            delta = delta / 10.0;
          }
        }
        bVar4 = IsNavInputDown(0xf);
        if (bVar4) {
          delta = delta * 10.0;
        }
        pIVar3->SliderCurrentAccum = delta + pIVar3->SliderCurrentAccum;
        pIVar3->SliderCurrentAccumDirty = true;
      }
      local_a0 = pIVar3->SliderCurrentAccum;
      if ((pIVar3->NavActivatePressedId == id) && ((pIVar3->ActiveIdIsJustActivated & 1U) == 0)) {
        ClearActiveID();
      }
      else if ((pIVar3->SliderCurrentAccumDirty & 1U) != 0) {
        grab_t = ScaleRatioFromValueT<long_long,long_long,double>
                           (data_type,*v,v_min,v_max,is_logarithmic_00,(float)decimal_precision,
                            fStack_70);
        if (((1.0 <= grab_t) && (0.0 < local_a0)) || ((grab_t <= 0.0 && (local_a0 < 0.0)))) {
          bVar2 = false;
          pIVar3->SliderCurrentAccum = 0.0;
        }
        else {
          bVar2 = true;
          v_new._4_4_ = grab_t;
          grab_t = ImSaturate(grab_t + local_a0);
          lStack_b0 = ScaleValueFromRatioT<long_long,long_long,double>
                                (data_type,grab_t,v_min,v_max,is_logarithmic_00,
                                 (float)decimal_precision,fStack_70);
          if ((bVar7 || bVar8) && ((flags & 0x40U) == 0)) {
            lStack_b0 = RoundScalarWithFormatT<long_long>(format,data_type,lStack_b0);
          }
          v_new_1._4_4_ =
               ScaleRatioFromValueT<long_long,long_long,double>
                         (data_type,lStack_b0,v_min,v_max,is_logarithmic_00,(float)decimal_precision
                          ,fStack_70);
          if (local_a0 <= 0.0) {
            fVar11 = ImMax<float>(v_new_1._4_4_ - v_new._4_4_,local_a0);
            pIVar3->SliderCurrentAccum = pIVar3->SliderCurrentAccum - fVar11;
          }
          else {
            fVar11 = ImMin<float>(v_new_1._4_4_ - v_new._4_4_,local_a0);
            pIVar3->SliderCurrentAccum = pIVar3->SliderCurrentAccum - fVar11;
          }
        }
        pIVar3->SliderCurrentAccumDirty = false;
      }
    }
    if (bVar2) {
      local_c0 = ScaleValueFromRatioT<long_long,long_long,double>
                           (data_type,grab_t,v_min,v_max,is_logarithmic_00,(float)decimal_precision,
                            fStack_70);
      if ((bVar7 || bVar8) && ((flags & 0x40U) == 0)) {
        local_c0 = RoundScalarWithFormatT<long_long>(format,data_type,local_c0);
      }
      mouse_abs_pos._3_1_ = *v != local_c0;
      if (mouse_abs_pos._3_1_) {
        *v = local_c0;
      }
    }
  }
  if (1.0 <= fVar9) {
    local_d4 = ScaleRatioFromValueT<long_long,long_long,double>
                         (data_type,*v,v_min,v_max,is_logarithmic_00,(float)decimal_precision,
                          fStack_70);
    if (uVar5 == 1) {
      local_d4 = 1.0 - local_d4;
    }
    local_d8 = ImLerp<float>(fVar12,fVar13,local_d4);
    if (uVar5 == 0) {
      ImRect::ImRect(&local_e8,-fVar10 * 0.5 + local_d8,(bb->Min).y + 2.0,fVar10 * 0.5 + local_d8,
                     (bb->Max).y - 2.0);
      out_grab_bb->Min = local_e8.Min;
      out_grab_bb->Max = local_e8.Max;
    }
    else {
      ImRect::ImRect(&local_f8,(bb->Min).x + 2.0,-fVar10 * 0.5 + local_d8,(bb->Max).x - 2.0,
                     fVar10 * 0.5 + local_d8);
      out_grab_bb->Min = local_f8.Min;
      out_grab_bb->Max = local_f8.Max;
    }
  }
  else {
    ImRect::ImRect((ImRect *)&grab_pos_1,&bb->Min,&bb->Min);
    out_grab_bb->Min = _grab_pos_1;
    out_grab_bb->Max = local_c8;
  }
  return mouse_abs_pos._3_1_;
}

Assistant:

bool ImGui::SliderBehaviorT(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, TYPE* v, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) != 0;
    const bool is_floating_point = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const SIGNEDTYPE v_range = (v_min < v_max ? v_max - v_min : v_min - v_max);

    // Calculate bounds
    const float grab_padding = 2.0f; // FIXME: Should be part of style.
    const float slider_sz = (bb.Max[axis] - bb.Min[axis]) - grab_padding * 2.0f;
    float grab_sz = style.GrabMinSize;
    if (!is_floating_point && v_range >= 0)                                     // v_range < 0 may happen on integer overflows
        grab_sz = ImMax((float)(slider_sz / (v_range + 1)), style.GrabMinSize); // For integer sliders: if possible have the grab size represent 1 unit
    grab_sz = ImMin(grab_sz, slider_sz);
    const float slider_usable_sz = slider_sz - grab_sz;
    const float slider_usable_pos_min = bb.Min[axis] + grab_padding + grab_sz * 0.5f;
    const float slider_usable_pos_max = bb.Max[axis] - grab_padding - grab_sz * 0.5f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    float zero_deadzone_halfsize = 0.0f; // Only valid when is_logarithmic is true
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);
        zero_deadzone_halfsize = (style.LogSliderDeadzone * 0.5f) / ImMax(slider_usable_sz, 1.0f);
    }

    // Process interacting with the slider
    bool value_changed = false;
    if (g.ActiveId == id)
    {
        bool set_new_value = false;
        float clicked_t = 0.0f;
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (!g.IO.MouseDown[0])
            {
                ClearActiveID();
            }
            else
            {
                const float mouse_abs_pos = g.IO.MousePos[axis];
                if (g.ActiveIdIsJustActivated)
                {
                    float grab_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
                    if (axis == ImGuiAxis_Y)
                        grab_t = 1.0f - grab_t;
                    const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
                    const bool clicked_around_grab = (mouse_abs_pos >= grab_pos - grab_sz * 0.5f - 1.0f) && (mouse_abs_pos <= grab_pos + grab_sz * 0.5f + 1.0f); // No harm being extra generous here.
                    g.SliderGrabClickOffset = (clicked_around_grab && is_floating_point) ? mouse_abs_pos - grab_pos : 0.0f;
                }
                if (slider_usable_sz > 0.0f)
                    clicked_t = ImSaturate((mouse_abs_pos - g.SliderGrabClickOffset - slider_usable_pos_min) / slider_usable_sz);
                if (axis == ImGuiAxis_Y)
                    clicked_t = 1.0f - clicked_t;
                set_new_value = true;
            }
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            if (g.ActiveIdIsJustActivated)
            {
                g.SliderCurrentAccum = 0.0f; // Reset any stored nav delta upon activation
                g.SliderCurrentAccumDirty = false;
            }

            const ImVec2 input_delta2 = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiNavReadMode_RepeatFast, 0.0f, 0.0f);
            float input_delta = (axis == ImGuiAxis_X) ? input_delta2.x : -input_delta2.y;
            if (input_delta != 0.0f)
            {
                const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 0;
                if (decimal_precision > 0)
                {
                    input_delta /= 100.0f;    // Gamepad/keyboard tweak speeds in % of slider bounds
                    if (IsNavInputDown(ImGuiNavInput_TweakSlow))
                        input_delta /= 10.0f;
                }
                else
                {
                    if ((v_range >= -100.0f && v_range <= 100.0f) || IsNavInputDown(ImGuiNavInput_TweakSlow))
                        input_delta = ((input_delta < 0.0f) ? -1.0f : +1.0f) / (float)v_range; // Gamepad/keyboard tweak speeds in integer steps
                    else
                        input_delta /= 100.0f;
                }
                if (IsNavInputDown(ImGuiNavInput_TweakFast))
                    input_delta *= 10.0f;

                g.SliderCurrentAccum += input_delta;
                g.SliderCurrentAccumDirty = true;
            }

            float delta = g.SliderCurrentAccum;
            if (g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            {
                ClearActiveID();
            }
            else if (g.SliderCurrentAccumDirty)
            {
                clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                if ((clicked_t >= 1.0f && delta > 0.0f) || (clicked_t <= 0.0f && delta < 0.0f)) // This is to avoid applying the saturation when already past the limits
                {
                    set_new_value = false;
                    g.SliderCurrentAccum = 0.0f; // If pushing up against the limits, don't continue to accumulate
                }
                else
                {
                    set_new_value = true;
                    float old_clicked_t = clicked_t;
                    clicked_t = ImSaturate(clicked_t + delta);

                    // Calculate what our "new" clicked_t will be, and thus how far we actually moved the slider, and subtract this from the accumulator
                    TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
                    if (is_floating_point && !(flags & ImGuiSliderFlags_NoRoundToFormat))
                        v_new = RoundScalarWithFormatT<TYPE>(format, data_type, v_new);
                    float new_clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                    if (delta > 0)
                        g.SliderCurrentAccum -= ImMin(new_clicked_t - old_clicked_t, delta);
                    else
                        g.SliderCurrentAccum -= ImMax(new_clicked_t - old_clicked_t, delta);
                }

                g.SliderCurrentAccumDirty = false;
            }
        }

        if (set_new_value)
        {
            TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

            // Round to user desired precision based on format string
            if (is_floating_point && !(flags & ImGuiSliderFlags_NoRoundToFormat))
                v_new = RoundScalarWithFormatT<TYPE>(format, data_type, v_new);

            // Apply result
            if (*v != v_new)
            {
                *v = v_new;
                value_changed = true;
            }
        }
    }

    if (slider_sz < 1.0f)
    {
        *out_grab_bb = ImRect(bb.Min, bb.Min);
    }
    else
    {
        // Output grab position so it can be displayed by the caller
        float grab_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        if (axis == ImGuiAxis_Y)
            grab_t = 1.0f - grab_t;
        const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
        if (axis == ImGuiAxis_X)
            *out_grab_bb = ImRect(grab_pos - grab_sz * 0.5f, bb.Min.y + grab_padding, grab_pos + grab_sz * 0.5f, bb.Max.y - grab_padding);
        else
            *out_grab_bb = ImRect(bb.Min.x + grab_padding, grab_pos - grab_sz * 0.5f, bb.Max.x - grab_padding, grab_pos + grab_sz * 0.5f);
    }

    return value_changed;
}